

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolver.cpp
# Opt level: O2

void __thiscall chrono::ChSolver::ArchiveIN(ChSolver *this,ChArchiveIn *marchive)

{
  Type type;
  Type_mapper typemapper;
  Type local_8c;
  ChEnumMapper<chrono::ChSolver::Type> local_88;
  ChEnumMapper<chrono::ChSolver::Type> local_68;
  ChNameValue<bool> local_48;
  ChNameValue<chrono::ChEnumMapper<chrono::ChSolver::Type>_> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChSolver>(marchive);
  my_enum_mappers::Type_mapper::Type_mapper((Type_mapper *)&local_88);
  local_8c = (*this->_vptr_ChSolver[2])(this);
  my_enum_mappers::Type_mapper::operator()(&local_68,(Type_mapper *)&local_88,&local_8c);
  local_30._name = "solver_type";
  local_30._flags = '\0';
  local_30._value = &local_68;
  ChArchiveIn::operator>>(marchive,&local_30);
  ChEnumMapper<chrono::ChSolver::Type>::~ChEnumMapper(&local_68);
  local_48._value = &this->verbose;
  local_48._name = "verbose";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  ChEnumMapper<chrono::ChSolver::Type>::~ChEnumMapper(&local_88);
  return;
}

Assistant:

void ChSolver::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/marchive.VersionRead<ChSolver>();
    // solver type:
    my_enum_mappers::Type_mapper typemapper;
    Type type = GetType();
    marchive >> CHNVP(typemapper(type), "solver_type");
    // stream in all member data:
    marchive >> CHNVP(verbose);
}